

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command-line.hpp
# Opt level: O0

string * __thiscall henson::CommandLine::executable(CommandLine *this,string *prefix)

{
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  string *exec;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  difference_type in_stack_ffffffffffffff50;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff58;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> __end;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> __beg;
  string local_70 [55];
  allocator<char> local_39;
  char *local_38;
  char *local_30;
  char *local_28;
  undefined1 local_19;
  
  local_19 = 0;
  __end._M_current = (char *)0x0;
  __beg._M_current = (char *)in_RDI;
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::operator[]((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                *)in_RSI,0);
  local_28 = (char *)std::vector<char,_std::allocator<char>_>::begin(in_stack_ffffffffffffff48);
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::operator[]((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                *)in_RSI,(size_type)__end._M_current);
  local_38 = (char *)std::vector<char,_std::allocator<char>_>::end(in_stack_ffffffffffffff48);
  local_30 = (char *)__gnu_cxx::
                     __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
                     operator-(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::allocator<char>::allocator();
  std::__cxx11::string::
  string<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,void>
            (in_RSI,__beg,__end,(allocator<char> *)in_RDI);
  std::allocator<char>::~allocator(&local_39);
  pcVar1 = (char *)std::__cxx11::string::operator[](__beg._M_current);
  if ((*pcVar1 != '/') &&
     (pcVar1 = (char *)std::__cxx11::string::operator[](__beg._M_current), *pcVar1 != '~')) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __end._M_current,in_RSI);
    std::__cxx11::string::operator=((string *)__beg._M_current,local_70);
    std::__cxx11::string::~string(local_70);
  }
  return in_RDI;
}

Assistant:

std::string                 executable(std::string prefix = "") const
    {
        auto exec = std::string(arguments[0].begin(), arguments[0].end() - 1);
        if (exec[0] != '/' && exec[0] != '~')
            exec = prefix + exec;
        return exec;
    }